

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void print_panel_seg(int n,int w,int jcol,int nseg,int *segrep,int *repfnz)

{
  uint local_30;
  uint local_2c;
  int k;
  int j;
  int *repfnz_local;
  int *segrep_local;
  int nseg_local;
  int jcol_local;
  int w_local;
  int n_local;
  
  for (local_2c = jcol; (int)local_2c < jcol + w; local_2c = local_2c + 1) {
    printf("\tcol %d:\n",(ulong)local_2c);
    for (local_30 = 0; (int)local_30 < nseg; local_30 = local_30 + 1) {
      printf("\t\tseg %d, segrep %d, repfnz %d\n",(ulong)local_30,(ulong)(uint)segrep[(int)local_30]
             ,(ulong)(uint)repfnz[(int)((local_2c - jcol) * n + segrep[(int)local_30])]);
    }
  }
  return;
}

Assistant:

void print_panel_seg(int n, int w, int jcol, int nseg,
                     const int *segrep, const int *repfnz)
{
    int j, k;
    
    for (j = jcol; j < jcol+w; j++) {
	printf("\tcol %d:\n", j);
	for (k = 0; k < nseg; k++)
	    printf("\t\tseg %d, segrep %d, repfnz %d\n", k, 
			segrep[k], repfnz[(j-jcol)*n + segrep[k]]);
    }

}